

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

bool __thiscall GGSock::FileServer::Impl::updateClientInfos(Impl *this)

{
  pointer pCVar1;
  bool bVar2;
  undefined8 in_RAX;
  mapped_type *this_00;
  int iVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::
  _Rb_tree<int,_std::pair<const_int,_GGSock::FileServer::ClientInfo>,_std::_Select1st<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
  ::clear(&(this->clientInfos)._M_t);
  iVar3 = 0;
  while( true ) {
    uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38);
    pCVar1 = (this->clients).
             super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)(((long)(this->clients).
                     super__Vector_base<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0xa8) <= iVar3)
    break;
    bVar2 = Communicator::isConnected
                      (pCVar1[iVar3].communicator.
                       super___shared_ptr<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar2) {
      this_00 = std::
                map<int,_GGSock::FileServer::ClientInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::ClientInfo>_>_>
                ::operator[](&this->clientInfos,(key_type_conflict *)((long)&uStack_38 + 4));
      ClientInfo::operator=(this_00,&pCVar1[iVar3].info);
    }
    iVar3 = uStack_38._4_4_ + 1;
  }
  return true;
}

Assistant:

bool updateClientInfos() {
        clientInfos.clear();

        for (int i = 0; i < (int) clients.size(); ++i) {
            const auto & client = clients[i];
            if (client.communicator->isConnected() == false) {
                continue;
            }

            clientInfos[i] = client.info;
        }

        return true;
    }